

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierExpression.cpp
# Opt level: O1

string * __thiscall
hdc::IdentifierExpression::getName_abi_cxx11_
          (string *__return_storage_ptr__,IdentifierExpression *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = Token::getLexem_abi_cxx11_(&this->name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string IdentifierExpression::getName() {
    return name.getLexem();
}